

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O1

int Abc_ZddCountNodesArray(Abc_ZddMan *p,Vec_Int_t *vNodes)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  if (vNodes->nSize < 1) {
    iVar2 = 0;
  }
  else {
    lVar3 = 0;
    iVar2 = 0;
    do {
      iVar1 = Abc_ZddCount_rec(p,vNodes->pArray[lVar3]);
      iVar2 = iVar2 + iVar1;
      lVar3 = lVar3 + 1;
    } while (lVar3 < vNodes->nSize);
  }
  if (0 < vNodes->nSize) {
    lVar3 = 0;
    do {
      Abc_ZddUnmark_rec(p,vNodes->pArray[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 < vNodes->nSize);
  }
  return iVar2;
}

Assistant:

int Abc_ZddCountNodesArray( Abc_ZddMan * p, Vec_Int_t * vNodes )
{
    int i, Id, Count = 0;
    Vec_IntForEachEntry( vNodes, Id, i )
        Count += Abc_ZddCount_rec( p, Id );
    Vec_IntForEachEntry( vNodes, Id, i )
        Abc_ZddUnmark_rec( p, Id );
    return Count;
}